

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

int __thiscall
tetgenmesh::sremovevertex(tetgenmesh *this,point delpt,face *parentsh,face *parentseg,int lawson)

{
  shellface *pppdVar1;
  uint *puVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  shellface ppdVar7;
  shellface ppdVar8;
  shellface ppdVar9;
  undefined8 *puVar10;
  memorypool *pmVar11;
  point pd;
  char **ppcVar12;
  shellface *pppdVar13;
  long lVar14;
  char *pcVar15;
  long lVar16;
  char *pcVar17;
  arraypool *paVar18;
  uint uVar19;
  int iVar20;
  shellface *pppdVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  int *piVar26;
  ulong uVar27;
  shellface ppdVar28;
  undefined8 *puVar29;
  uint uVar30;
  ulong *puVar31;
  double dVar32;
  double dVar33;
  face abseg;
  face local_a8;
  ulong local_98;
  uint local_90;
  undefined8 local_78;
  undefined4 local_70;
  face local_68;
  undefined8 *local_58;
  face *local_50;
  shellface local_48;
  face local_40;
  
  lVar14 = 0;
  do {
    *(undefined8 *)((long)&local_a8.sh + lVar14) = 0;
    *(undefined4 *)((long)&local_a8.shver + lVar14) = 0;
    lVar14 = lVar14 + 0x10;
  } while (lVar14 != 0x40);
  if (parentseg == (face *)0x0) {
    if (2 < this->b->verbose) {
      printf("      Remove vertex %d from surface.\n",
             (ulong)*(uint *)((long)delpt + (long)this->pointmarkindex * 4));
    }
    parentsh->shver = snextpivot[parentsh->shver];
    paVar18 = this->cavesegshlist;
    pcVar15 = arraypool::getblock(paVar18,(int)paVar18->objects);
    lVar14 = (long)paVar18->objectbytes * ((long)paVar18->objectsperblock - 1U & paVar18->objects);
    paVar18->objects = paVar18->objects + 1;
    *(shellface **)(pcVar15 + lVar14) = parentsh->sh;
    *(int *)(pcVar15 + lVar14 + 8) = parentsh->shver;
  }
  else {
    local_40.sh = (shellface *)0x0;
    local_40.shver = 0;
    local_68.sh = (shellface *)0x0;
    local_68.shver = 0;
    local_58 = (undefined8 *)
               ((ulong)parentseg->sh[snextpivot[snextpivot[parentseg->shver]] >> 1] &
               0xfffffffffffffff8);
    ppdVar7 = (shellface)local_58[sorgpivot[0]];
    ppdVar8 = parentseg->sh[sdestpivot[parentseg->shver]];
    if (2 < this->b->verbose) {
      lVar14 = (long)this->pointmarkindex;
      printf("      Remove vertex %d from segment [%d, %d].\n",
             (ulong)*(uint *)((long)delpt + lVar14 * 4),(ulong)*(uint *)((long)ppdVar7 + lVar14 * 4)
             ,(ulong)*(uint *)((long)ppdVar8 + lVar14 * 4));
    }
    makeshellface(this,this->subsegs,&local_40);
    iVar6 = local_40.shver;
    pppdVar13 = local_40.sh;
    uVar27 = (ulong)local_40.shver;
    local_40.sh[sorgpivot[uVar27]] = ppdVar7;
    local_40.sh[sdestpivot[uVar27]] = ppdVar8;
    local_40.sh[sapexpivot[uVar27]] = (shellface)0x0;
    pppdVar21 = parentseg->sh;
    *(undefined4 *)((long)local_40.sh + (long)this->shmarkindex * 4) =
         *(undefined4 *)((long)pppdVar21 + (long)this->shmarkindex * 4);
    if (this->checkconstraints != 0) {
      local_40.sh[this->areaboundindex] = pppdVar21[this->areaboundindex];
    }
    if (this->useinsertradius != 0) {
      *(undefined4 *)((long)local_40.sh + (long)this->shmarkindex * 4 + 8) =
           *(undefined4 *)((long)pppdVar21 + (long)this->shmarkindex * 4 + 8);
    }
    uVar22 = (ulong)snextpivot[0];
    iVar20 = snextpivot[uVar22];
    lVar14 = (long)(iVar20 >> 1);
    uVar25 = local_58[lVar14] & 0xfffffffffffffff8;
    if (uVar25 != 0) {
      iVar4 = snextpivot[snextpivot[uVar27]];
      *(ulong *)(uVar25 + (long)(snextpivot[0] >> 1) * 8) = (long)iVar4 | (ulong)local_40.sh;
      local_40.sh[iVar4 >> 1] = (shellface)(uVar25 | uVar22);
      pppdVar21 = parentseg->sh;
    }
    iVar4 = parentseg->shver;
    uVar22 = (ulong)pppdVar21[snextpivot[iVar4] >> 1] & 0xfffffffffffffff8;
    if (uVar22 != 0) {
      iVar5 = snextpivot[uVar27];
      *(ulong *)(uVar22 + lVar14 * 8) = (long)iVar5 | (ulong)local_40.sh;
      local_40.sh[iVar5 >> 1] = (shellface)((long)iVar20 | uVar22);
    }
    ppdVar28 = (shellface)(uVar27 | (ulong)local_40.sh);
    iVar20 = this->point2simindex;
    ppdVar7[(long)iVar20 + 2] = (double *)ppdVar28;
    ppdVar8[(long)iVar20 + 2] = (double *)ppdVar28;
    ppdVar9 = parentseg->sh[iVar4 >> 1];
    uVar30 = (uint)ppdVar9 & 7;
    parentsh->shver = uVar30;
    pppdVar21 = (shellface *)((ulong)ppdVar9 & 0xfffffffffffffff8);
    parentsh->sh = pppdVar21;
    local_50 = parentseg;
    local_48 = ppdVar8;
    if (pppdVar21 != (shellface *)0x0) {
      do {
        paVar18 = this->caveshlist;
        pcVar15 = arraypool::getblock(paVar18,(int)paVar18->objects);
        lVar14 = (long)paVar18->objectbytes *
                 ((long)paVar18->objectsperblock - 1U & paVar18->objects);
        paVar18->objects = paVar18->objects + 1;
        *(shellface **)(pcVar15 + lVar14) = pppdVar21;
        *(uint *)(pcVar15 + lVar14 + 8) = uVar30;
        pppdVar1 = pppdVar21 + (uVar30 >> 1);
        pppdVar21 = (shellface *)((ulong)*pppdVar1 & 0xfffffffffffffff8);
        if (pppdVar21 == (shellface *)0x0) break;
        uVar30 = (uint)*pppdVar1 & 7;
      } while (parentsh->sh != pppdVar21);
    }
    paVar18 = this->caveshlist;
    if (0 < paVar18->objects) {
      lVar14 = 0;
      do {
        lVar16 = (long)paVar18->objectbytes *
                 (long)(int)(paVar18->objectsperblockmark & (uint)lVar14);
        puVar10 = *(undefined8 **)
                   (paVar18->toparray[(uint)lVar14 >> ((byte)paVar18->log2objectsperblock & 0x1f)] +
                   lVar16);
        uVar30 = *(uint *)(paVar18->toparray
                           [(uint)lVar14 >> ((byte)paVar18->log2objectsperblock & 0x1f)] +
                          lVar16 + 8);
        uVar27 = (ulong)(int)((point)puVar10[sorgpivot[(int)uVar30]] != delpt ^ uVar30);
        iVar20 = snextpivot[snextpivot[uVar27]];
        puVar29 = puVar10;
        if ((ulong)puVar10[(long)(iVar20 >> 1) + 6] < 8) {
          puVar31 = puVar10 + (iVar20 >> 1);
          do {
            uVar19 = (uint)*puVar31 & 7;
            puVar29 = (undefined8 *)(*puVar31 & 0xfffffffffffffff8);
            iVar20 = snextpivot[snextpivot[(point)puVar29[sorgpivot[uVar19]] != delpt ^ uVar19]];
            puVar31 = puVar29 + (iVar20 >> 1);
          } while (puVar31[6] < 8);
          if (puVar10 == puVar29) goto LAB_00127084;
          puVar10[(long)((int)uVar30 >> 1) + 6] = 0;
          puVar31[6] = 0;
          makeshellface(this,this->subfaces,&local_68);
          uVar22 = (ulong)local_68.shver;
          local_68.sh[sorgpivot[uVar22]] = ppdVar7;
          local_68.sh[sdestpivot[uVar22]] = local_48;
          local_68.sh[sapexpivot[uVar22]] = (shellface)delpt;
          *(undefined4 *)((long)local_68.sh + (long)this->shmarkindex * 4) =
               *(undefined4 *)((long)puVar10 + (long)this->shmarkindex * 4);
          local_68.sh[(long)(local_68.shver >> 1) + 6] = ppdVar28;
          *pppdVar13 = (shellface)(uVar22 | (ulong)local_68.sh);
          iVar4 = snextpivot[uVar22];
          local_68.sh[iVar4 >> 1] = (shellface)(uVar27 | (ulong)puVar10);
          puVar10[(int)uVar30 >> 1] = (long)iVar4 | (ulong)local_68.sh;
          iVar4 = snextpivot[iVar4];
          local_68.sh[iVar4 >> 1] = (shellface)((ulong)puVar29 | (long)iVar20);
          *puVar31 = (long)iVar4 | (ulong)local_68.sh;
          puVar2 = (uint *)((long)local_68.sh + (long)this->shmarkindex * 4 + 4);
          *puVar2 = *puVar2 | 2;
        }
        else {
LAB_00127084:
          uVar30 = (uint)puVar29[snextpivot[snextpivot[iVar20]] >> 1];
          local_68.shver = uVar30 & 7;
          local_68.sh = (shellface *)
                        (puVar29[snextpivot[snextpivot[iVar20]] >> 1] & 0xfffffffffffffff8);
          local_68.shver =
               (uint)(local_68.sh[sorgpivot[(uint)local_68.shver]] != ppdVar7) ^ local_68.shver;
          uVar27 = (ulong)(uVar30 & 6);
          *(undefined8 *)((long)local_68.sh + uVar27 * 4) = 0;
          *(shellface *)((long)local_68.sh + uVar27 * 4 + 0x30) = ppdVar28;
          *pppdVar13 = (shellface)((ulong)(uint)local_68.shver + (long)local_68.sh);
          pmVar11 = this->subfaces;
          puVar29[3] = 0;
          *puVar29 = pmVar11->deaditemstack;
          pmVar11->deaditemstack = puVar29;
          pmVar11->items = pmVar11->items + -1;
        }
        iVar20 = local_68.shver;
        pppdVar21 = local_68.sh;
        paVar18 = this->cavesegshlist;
        pcVar15 = arraypool::getblock(paVar18,(int)paVar18->objects);
        lVar16 = (long)paVar18->objectbytes *
                 ((long)paVar18->objectsperblock - 1U & paVar18->objects);
        paVar18->objects = paVar18->objects + 1;
        *(shellface **)(pcVar15 + lVar16) = pppdVar21;
        *(int *)(pcVar15 + lVar16 + 8) = iVar20;
        lVar14 = lVar14 + 1;
        paVar18 = this->caveshlist;
      } while (lVar14 < paVar18->objects);
    }
    paVar18->objects = 0;
    paVar18 = this->cavesegshlist;
    uVar27 = paVar18->objects;
    if (1 < (long)uVar27) {
      uVar22 = 0;
      do {
        bVar3 = (byte)paVar18->log2objectsperblock;
        pcVar15 = paVar18->toparray[(uint)uVar22 >> (bVar3 & 0x1f)];
        lVar14 = (long)(int)((paVar18->objectsperblockmark & (uint)uVar22) * paVar18->objectbytes);
        uVar22 = uVar22 + 1;
        uVar30 = (uint)(uVar22 % uVar27);
        pcVar17 = paVar18->toparray[uVar30 >> (bVar3 & 0x1f)];
        lVar16 = (long)(int)((paVar18->objectsperblockmark & uVar30) * paVar18->objectbytes);
        *(ulong *)(*(long *)(pcVar15 + lVar14) + (long)(*(int *)(pcVar15 + lVar14 + 8) >> 1) * 8) =
             (long)*(int *)(pcVar17 + lVar16 + 8) | *(ulong *)(pcVar17 + lVar16);
        paVar18 = this->cavesegshlist;
        uVar27 = paVar18->objects;
      } while ((long)uVar22 < (long)uVar27);
    }
    pmVar11 = this->subsegs;
    pppdVar21 = local_50->sh;
    pppdVar21[3] = (shellface)0x0;
    *pppdVar21 = (shellface)pmVar11->deaditemstack;
    pmVar11->deaditemstack = pppdVar21;
    pmVar11->items = pmVar11->items + -1;
    pmVar11 = this->subsegs;
    local_58[3] = 0;
    *local_58 = pmVar11->deaditemstack;
    pmVar11->deaditemstack = local_58;
    pmVar11->items = pmVar11->items + -1;
    local_50->sh = pppdVar13;
    local_50->shver = iVar6;
  }
  paVar18 = this->cavesegshlist;
  if (0 < paVar18->objects) {
    lVar14 = 0;
    do {
      pcVar15 = paVar18->toparray[(uint)lVar14 >> ((byte)paVar18->log2objectsperblock & 0x1f)];
      lVar16 = (long)paVar18->objectbytes * (long)(int)(paVar18->objectsperblockmark & (uint)lVar14)
      ;
      uVar27 = *(ulong *)(*(long *)(pcVar15 + lVar16) +
                         (long)(snextpivot[*(int *)(pcVar15 + lVar16 + 8)] >> 1) * 8);
      uVar30 = (uint)uVar27 & 7;
      uVar22 = (ulong)uVar30;
      *(uint *)(pcVar15 + lVar16 + 8) = uVar30;
      uVar27 = uVar27 & 0xfffffffffffffff8;
      *(ulong *)(pcVar15 + lVar16) = uVar27;
      if (*(point *)(uVar27 + (long)sorgpivot[uVar22] * 8) != delpt) {
        uVar22 = (ulong)(uVar30 ^ 1);
        *(uint *)(pcVar15 + lVar16 + 8) = uVar30 ^ 1;
      }
      if (*(point *)(uVar27 + (long)sorgpivot[uVar22] * 8) == delpt) {
        while( true ) {
          while( true ) {
            paVar18 = this->caveshlist;
            pcVar17 = arraypool::getblock(paVar18,(int)paVar18->objects);
            lVar23 = (long)paVar18->objectbytes *
                     ((long)paVar18->objectsperblock - 1U & paVar18->objects);
            paVar18->objects = paVar18->objects + 1;
            *(ulong *)(pcVar17 + lVar23) = uVar27;
            *(int *)(pcVar17 + lVar23 + 8) = (int)uVar22;
            uVar22 = *(ulong *)(uVar27 + (long)(snextpivot[snextpivot[(int)uVar22]] >> 1) * 8);
            uVar27 = uVar22 & 0xfffffffffffffff8;
            if (*(ulong *)(pcVar15 + lVar16) == uVar27) break;
            uVar30 = (uint)uVar22 & 7;
            uVar22 = (ulong)(*(point *)(uVar27 + (long)sorgpivot[uVar30] * 8) != delpt ^ uVar30);
          }
          paVar18 = this->caveshlist;
          if (paVar18->objects == 3) break;
          if (paVar18->objects < 1) {
            lVar23 = 0;
            pppdVar21 = local_a8.sh;
            iVar6 = local_a8.shver;
            uVar27 = local_98;
            uVar30 = local_90;
          }
          else {
            lVar23 = 0;
            do {
              lVar24 = (long)paVar18->objectbytes *
                       (long)(int)(paVar18->objectsperblockmark & (uint)lVar23);
              pppdVar21 = *(shellface **)
                           (paVar18->toparray
                            [(uint)lVar23 >> ((byte)paVar18->log2objectsperblock & 0x1f)] + lVar24);
              iVar6 = *(int *)(paVar18->toparray
                               [(uint)lVar23 >> ((byte)paVar18->log2objectsperblock & 0x1f)] +
                              lVar24 + 8);
              uVar30 = (uint)pppdVar21[iVar6 >> 1] & 7;
              uVar27 = (ulong)pppdVar21[iVar6 >> 1] & 0xfffffffffffffff8;
              ppdVar7 = pppdVar21[sorgpivot[iVar6]];
              uVar30 = ppdVar7 != *(shellface *)(uVar27 + (long)sdestpivot[uVar30] * 8) ^ uVar30;
              if (((*(byte *)((long)pppdVar21 + (long)this->shmarkindex * 4 + 4) & 2) == 0) &&
                 ((*(byte *)(uVar27 + 4 + (long)this->shmarkindex * 4) & 2) == 0)) {
                ppdVar8 = pppdVar21[sdestpivot[iVar6]];
                ppdVar9 = pppdVar21[sapexpivot[iVar6]];
                pd = *(point *)(uVar27 + (long)sapexpivot[uVar30] * 8);
                calculateabovepoint4(this,(point)ppdVar7,(point)ppdVar8,(point)ppdVar9,pd);
                dVar32 = orient3d((double *)ppdVar9,pd,this->dummypoint,(double *)ppdVar7);
                dVar33 = orient3d((double *)ppdVar9,pd,this->dummypoint,(double *)ppdVar8);
                if (dVar33 * dVar32 < 0.0) {
                  local_a8.sh = pppdVar21;
                  local_a8.shver = iVar6;
                  local_98 = uVar27;
                  local_90 = uVar30;
                  flip22(this,&local_a8,lawson,0);
                  *(ulong *)(pcVar15 + lVar16) = local_98;
                  *(int *)(pcVar15 + lVar16 + 8) = snextpivot[snextpivot[(int)local_90]];
                  paVar18 = this->caveshbdlist;
                  pcVar17 = arraypool::getblock(paVar18,(int)paVar18->objects);
                  lVar24 = (long)paVar18->objectbytes *
                           ((long)paVar18->objectsperblock - 1U & paVar18->objects);
                  paVar18->objects = paVar18->objects + 1;
                  *(shellface **)(pcVar17 + lVar24) = local_a8.sh;
                  *(int *)(pcVar17 + lVar24 + 8) = local_a8.shver;
                  paVar18 = this->caveshlist;
                  pppdVar21 = local_a8.sh;
                  iVar6 = local_a8.shver;
                  uVar27 = local_98;
                  uVar30 = local_90;
                  break;
                }
                paVar18 = this->caveshlist;
              }
              lVar23 = lVar23 + 1;
            } while (lVar23 < paVar18->objects);
          }
          local_90 = uVar30;
          local_98 = uVar27;
          local_a8.shver = iVar6;
          local_a8.sh = pppdVar21;
          if (paVar18->objects == lVar23) {
            local_a8.sh = *(shellface **)*paVar18->toparray;
            local_a8.shver = (int)*(long *)((long)*paVar18->toparray + 8);
            local_90 = (uint)local_a8.sh[local_a8.shver >> 1] & 7;
            local_98 = (ulong)local_a8.sh[local_a8.shver >> 1] & 0xfffffffffffffff8;
            if (local_a8.sh[sorgpivot[local_a8.shver]] !=
                *(shellface *)(local_98 + (long)sdestpivot[local_90] * 8)) {
              local_90 = local_90 ^ 1;
            }
            flip22(this,&local_a8,lawson,0);
            *(ulong *)(pcVar15 + lVar16) = local_98;
            *(int *)(pcVar15 + lVar16 + 8) = snextpivot[snextpivot[(int)local_90]];
            paVar18 = this->caveshbdlist;
            pcVar17 = arraypool::getblock(paVar18,(int)paVar18->objects);
            lVar23 = (long)paVar18->objectbytes *
                     ((long)paVar18->objectsperblock - 1U & paVar18->objects);
            paVar18->objects = paVar18->objects + 1;
            *(shellface **)(pcVar17 + lVar23) = local_a8.sh;
            *(int *)(pcVar17 + lVar23 + 8) = local_a8.shver;
            paVar18 = this->caveshlist;
          }
          paVar18->objects = 0;
          uVar27 = *(ulong *)(pcVar15 + lVar16);
          uVar22 = (ulong)*(uint *)(pcVar15 + lVar16 + 8);
        }
        ppcVar12 = paVar18->toparray;
        iVar6 = paVar18->log2objectsperblock;
        uVar30 = paVar18->objectsperblockmark;
        iVar20 = paVar18->objectbytes;
        piVar26 = &local_a8.shver;
        lVar16 = 0;
        do {
          pcVar15 = ppcVar12[(uint)lVar16 >> ((byte)iVar6 & 0x1f)];
          lVar23 = (long)(int)((uint)lVar16 & uVar30) * (long)iVar20;
          ((face *)(piVar26 + -2))->sh = *(shellface **)(pcVar15 + lVar23);
          *piVar26 = *(int *)(pcVar15 + lVar23 + 8);
          lVar16 = lVar16 + 1;
          piVar26 = piVar26 + 4;
        } while (lVar16 != 3);
        flip31(this,&local_a8,lawson);
        lVar16 = 0;
        do {
          pmVar11 = this->subfaces;
          puVar10 = *(undefined8 **)((long)&local_a8.sh + lVar16);
          puVar10[3] = 0;
          *puVar10 = pmVar11->deaditemstack;
          pmVar11->deaditemstack = puVar10;
          pmVar11->items = pmVar11->items + -1;
          lVar16 = lVar16 + 0x10;
        } while (lVar16 != 0x30);
        this->caveshlist->objects = 0;
        paVar18 = this->caveshbdlist;
        pcVar15 = arraypool::getblock(paVar18,(int)paVar18->objects);
        lVar16 = (long)paVar18->objectbytes *
                 ((long)paVar18->objectsperblock - 1U & paVar18->objects);
        paVar18->objects = paVar18->objects + 1;
        *(undefined8 *)(pcVar15 + lVar16) = local_78;
        *(undefined4 *)(pcVar15 + lVar16 + 8) = local_70;
        paVar18 = this->cavesegshlist;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < paVar18->objects);
  }
  paVar18->objects = 0;
  if (2 < this->b->verbose) {
    printf("      Created %ld new subfaces.\n",this->caveshbdlist->objects);
  }
  if (lawson != 0) {
    lawsonflip(this);
  }
  return 0;
}

Assistant:

int tetgenmesh::sremovevertex(point delpt, face* parentsh, face* parentseg,
                              int lawson)
{
  face flipfaces[4], spinsh, *parysh;
  point pa, pb, pc, pd;
  REAL ori1, ori2;
  int it, i, j;

  if (parentseg != NULL) {
    // 'delpt' (p) should be a Steiner point inserted in a segment [a,b],
    //   where 'parentseg' should be [p,b]. Find the segment [a,p].
    face startsh, neighsh, nextsh;
    face abseg, prevseg, checkseg;
    face adjseg1, adjseg2;
    face fakesh;
    senext2(*parentseg, prevseg);
    spivotself(prevseg);
    prevseg.shver = 0;
    // Restore the original segment [a,b].
    pa = sorg(prevseg);
    pb = sdest(*parentseg);
    if (b->verbose > 2) {
      printf("      Remove vertex %d from segment [%d, %d].\n", 
             pointmark(delpt), pointmark(pa), pointmark(pb));
    }
    makeshellface(subsegs, &abseg);
    setshvertices(abseg, pa, pb, NULL);
    setshellmark(abseg, shellmark(*parentseg));
    if (checkconstraints) {
      setareabound(abseg, areabound(*parentseg));
    }
    if (useinsertradius) {
      setfacetindex(abseg, getfacetindex(*parentseg));
    }
    // Connect [#, a]<->[a, b].
    senext2(prevseg, adjseg1);
    spivotself(adjseg1);
    if (adjseg1.sh != NULL) {
      adjseg1.shver = 0;
      senextself(adjseg1);
      senext2(abseg, adjseg2);
      sbond(adjseg1, adjseg2);
    }
    // Connect [a, b]<->[b, #].
    senext(*parentseg, adjseg1);
    spivotself(adjseg1);
    if (adjseg1.sh != NULL) {
      adjseg1.shver = 0;
      senext2self(adjseg1);
      senext(abseg, adjseg2);
      sbond(adjseg1, adjseg2);
    }
    // Update the point-to-segment map.
    setpoint2sh(pa, sencode(abseg));
    setpoint2sh(pb, sencode(abseg));

    // Get the faces in face ring at segment [p, b].
    //   Re-use array 'caveshlist'.
    spivot(*parentseg, *parentsh);
    if (parentsh->sh != NULL) {
      spinsh = *parentsh;
      while (1) {
        // Save this face in list.
        caveshlist->newindex((void **) &parysh);
        *parysh = spinsh;
        // Go to the next face in the ring.
        spivotself(spinsh);
        if (spinsh.sh == NULL) {
          break; // It is possible there is only one facet.
        }
        if (spinsh.sh == parentsh->sh) break;
      }
    }

    // Create the face ring of the new segment [a,b]. Each face in the ring
    //   is [a,b,p] (degenerated!). It will be removed (automatically).
    for (i = 0; i < caveshlist->objects; i++) {
      parysh = (face *) fastlookup(caveshlist, i);
      startsh = *parysh;
      if (sorg(startsh) != delpt) {
        sesymself(startsh);
      }      
      // startsh is [p, b, #1], find the subface [a, p, #2].
      neighsh = startsh;
      while (1) {
        senext2self(neighsh);
        sspivot(neighsh, checkseg);
        if (checkseg.sh != NULL) {
          // It must be the segment [a, p].
          break;
        }
        spivotself(neighsh);
        if (sorg(neighsh) != delpt) sesymself(neighsh);
      }
      // Now neighsh is [a, p, #2].
      if (neighsh.sh != startsh.sh) {
        // Detach the two subsegments [a,p] and [p,b] from subfaces.
        ssdissolve(startsh);
        ssdissolve(neighsh);
        // Create a degenerated subface [a,b,p]. It is used to: (1) hold the
        //   new segment [a,b]; (2) connect to the two adjacent subfaces
        //   [p,b,#] and [a,p,#].
        makeshellface(subfaces, &fakesh);
        setshvertices(fakesh, pa, pb, delpt);
        setshellmark(fakesh, shellmark(startsh));
        // Connect fakesh to the segment [a,b].
        ssbond(fakesh, abseg);
        // Connect fakesh to adjacent subfaces: [p,b,#1] and [a,p,#2].
        senext(fakesh, nextsh);
        sbond(nextsh, startsh);
        senext2(fakesh, nextsh);
        sbond(nextsh, neighsh);
        smarktest(fakesh); // Mark it as faked.
      } else {
        // Special case. There exists already a degenerated face [a,b,p]!
        //   There is no need to create a faked subface here.
        senext2self(neighsh); // [a,b,p]
        // Since we will re-connect the face ring using the faked subfaces.
        //   We put the adjacent face of [a,b,p] to the list.
        spivot(neighsh, startsh); // The original adjacent subface.
        if (sorg(startsh) != pa) sesymself(startsh);
        sdissolve(startsh);
        // Connect fakesh to the segment [a,b].
        ssbond(startsh, abseg);
        fakesh = startsh; // Do not mark it!
        // Delete the degenerated subface.
        shellfacedealloc(subfaces, neighsh.sh);
      }
      // Save the fakesh in list (for re-creating the face ring).
      cavesegshlist->newindex((void **) &parysh);
      *parysh = fakesh;
    } // i
    caveshlist->restart();

    // Re-create the face ring.
    if (cavesegshlist->objects > 1) {
      for (i = 0; i < cavesegshlist->objects; i++) {
        parysh = (face *) fastlookup(cavesegshlist, i);
        fakesh = *parysh;
        // Get the next face in the ring.
        j = (i + 1) % cavesegshlist->objects;
        parysh = (face *) fastlookup(cavesegshlist, j);
        nextsh = *parysh;
        sbond1(fakesh, nextsh);
      }
    }

    // Delete the two subsegments containing p.
    shellfacedealloc(subsegs, parentseg->sh);
    shellfacedealloc(subsegs, prevseg.sh);
    // Return the new segment.
    *parentseg = abseg;
  } else {
    // p is inside the surface.
    if (b->verbose > 2) {
      printf("      Remove vertex %d from surface.\n", pointmark(delpt));
    }
    // Let 'delpt' be its apex.
    senextself(*parentsh);
    // For unifying the code, we add parentsh to list.
    cavesegshlist->newindex((void **) &parysh);
    *parysh = *parentsh;
  }

  // Remove the point (p).

  for (it = 0; it < cavesegshlist->objects; it++) {
    parentsh = (face *) fastlookup(cavesegshlist, it); // [a,b,p]
    senextself(*parentsh); // [b,p,a].
    spivotself(*parentsh);
    if (sorg(*parentsh) != delpt) sesymself(*parentsh);
    // now parentsh is [p,b,#].
    if (sorg(*parentsh) != delpt) {
      // The vertex has already been removed in above special case.
      continue;
    }

    while (1) {      
      // Initialize the flip edge list. Re-use 'caveshlist'.
      spinsh = *parentsh; // [p, b, #]
      while (1) {
        caveshlist->newindex((void **) &parysh);
        *parysh = spinsh;
        senext2self(spinsh);
        spivotself(spinsh);
        if (spinsh.sh == parentsh->sh) break;
        if (sorg(spinsh) != delpt) sesymself(spinsh);
      } // while (1)

      if (caveshlist->objects == 3) {
        // Delete the point by a 3-to-1 flip.
        for (i = 0; i < 3; i++) {
          parysh = (face *) fastlookup(caveshlist, i);
          flipfaces[i] = *parysh;
        }
        flip31(flipfaces, lawson);
        for (i = 0; i < 3; i++) { 
          shellfacedealloc(subfaces, flipfaces[i].sh);
        }
        caveshlist->restart();
        // Save the new subface.
        caveshbdlist->newindex((void **) &parysh);
        *parysh = flipfaces[3];
        // The vertex is removed.
        break;
      }

      // Search an edge to flip.
      for (i = 0; i < caveshlist->objects; i++) {
        parysh = (face *) fastlookup(caveshlist, i);
        flipfaces[0] = *parysh;
        spivot(flipfaces[0], flipfaces[1]);
        if (sorg(flipfaces[0]) != sdest(flipfaces[1])) 
          sesymself(flipfaces[1]);
        // Skip this edge if it belongs to a faked subface.
        if (!smarktested(flipfaces[0]) && !smarktested(flipfaces[1])) {
          pa = sorg(flipfaces[0]);
          pb = sdest(flipfaces[0]);
          pc = sapex(flipfaces[0]);
          pd = sapex(flipfaces[1]);
          calculateabovepoint4(pa, pb, pc, pd);
          // Check if a 2-to-2 flip is possible.
          ori1 = orient3d(pc, pd, dummypoint, pa);
          ori2 = orient3d(pc, pd, dummypoint, pb);
          if (ori1 * ori2 < 0) {
            // A 2-to-2 flip is found.
            flip22(flipfaces, lawson, 0);
            // The i-th edge is flipped. The i-th and (i-1)-th subfaces are
            //   changed. The 'flipfaces[1]' contains p as its apex.
            senext2(flipfaces[1], *parentsh);
            // Save the new subface.
            caveshbdlist->newindex((void **) &parysh);
            *parysh = flipfaces[0];
            break;
          }
        } //
      } // i

      if (i == caveshlist->objects) {
        // Do a flip22 and a flip31 to remove p.
        parysh = (face *) fastlookup(caveshlist, 0);
        flipfaces[0] = *parysh;
        spivot(flipfaces[0], flipfaces[1]);
        if (sorg(flipfaces[0]) != sdest(flipfaces[1])) {
          sesymself(flipfaces[1]);
        }
        flip22(flipfaces, lawson, 0);
        senext2(flipfaces[1], *parentsh);
        // Save the new subface.
        caveshbdlist->newindex((void **) &parysh);
        *parysh = flipfaces[0];
      }

      // The edge list at p are changed.
      caveshlist->restart();
    } // while (1)

  } // it

  cavesegshlist->restart();

  if (b->verbose > 2) {
    printf("      Created %ld new subfaces.\n", caveshbdlist->objects);
  }


  if (lawson) {
    lawsonflip();
  }

  return 0;
}